

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O0

string * __thiscall iDynTree::XMLAttribute::description_abi_cxx11_(XMLAttribute *this)

{
  ulong uVar1;
  ostream *poVar2;
  string *in_RSI;
  string *in_RDI;
  ostringstream str;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_188,in_RSI + 0x40);
    std::operator<<(poVar2,":");
  }
  poVar2 = std::operator<<((ostream *)local_188,in_RSI);
  poVar2 = std::operator<<(poVar2,"=");
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,in_RSI + 0x20);
  std::operator<<(poVar2,"\"");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

const std::string XMLAttribute::description() const
    {
        std::ostringstream str;
        if (!m_prefix.empty()) {
            str << m_prefix << ":";
        }
        str << m_name << "=" << "\"" << m_value <<"\"";
        return str.str();
    }